

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void CreatePropertyGeneratorExpressions
               (cmake *cmakeInstance,cmBTStringRange entries,
               vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>_>_>
               *items,bool evaluateForBuildsystem)

{
  _Tuple_impl<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
  in_RAX;
  pointer *__ptr;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  _Var1;
  _Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false> local_38;
  
  local_38 = in_RAX.super__Head_base<0UL,_cmGeneratorTarget::TargetPropertyEntry_*,_false>.
             _M_head_impl;
  for (_Var1 = entries.Begin._M_current; _Var1._M_current != entries.End._M_current._M_current;
      _Var1._M_current = _Var1._M_current + 1) {
    CreateTargetPropertyEntry
              ((cmake *)&stack0xffffffffffffffc8,
               (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)cmakeInstance,SUB81(_Var1._M_current,0));
    std::
    vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>,std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>>>
    ::
    emplace_back<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>>
              ((vector<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>,std::allocator<std::unique_ptr<cmGeneratorTarget::TargetPropertyEntry,std::default_delete<cmGeneratorTarget::TargetPropertyEntry>>>>
                *)items,(unique_ptr<cmGeneratorTarget::TargetPropertyEntry,_std::default_delete<cmGeneratorTarget::TargetPropertyEntry>_>
                         *)&stack0xffffffffffffffc8);
    if (local_38._M_head_impl != (TargetPropertyEntry *)0x0) {
      (**(code **)((long)*(__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
                           *)local_38._M_head_impl + 8))();
    }
  }
  return;
}

Assistant:

std::vector<cmCustomCommand> const& cmGeneratorTarget::GetPreBuildCommands()
  const
{
  return this->Target->GetPreBuildCommands();
}